

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O0

bool_t zzIsSumWEq(word *b,word *a,size_t n,word w)

{
  size_t i;
  word diff;
  word w_local;
  size_t n_local;
  word *a_local;
  word *b_local;
  
  diff = 0;
  w_local = w;
  for (i = 0; i < n; i = i + 1) {
    diff = b[i] ^ a[i] + w_local | diff;
    w_local = (word)(int)(uint)(b[i] < a[i]);
  }
  return (bool_t)(diff == 0 && w_local == 0);
}

Assistant:

bool_t SAFE(zzIsSumWEq)(const word b[], const word a[], size_t n, 
	register word w)
{
	register word diff = 0;
	size_t i;
	ASSERT(wwIsValid(a, n));
	ASSERT(wwIsValid(b, n));
	for (i = 0; i < n; ++i)
	{
		diff |= b[i] ^ (a[i] + w);
		w = wordLess01(b[i], a[i]);
	}
	return wordEq(diff | w, 0);
}